

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

void Abs_ManSupport1_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int Entry;
  
  pGVar2 = p->pObjs;
  if (pGVar2 <= pObj) {
    do {
      if (pGVar2 + p->nObjs <= pObj) break;
      Entry = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= Entry) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[Entry] == p->nTravIds) {
        return;
      }
      p->pTravIds[Entry] = p->nTravIds;
      uVar1 = *(ulong *)pObj;
      if (((uVar1 >> 0x3e & 1) != 0) ||
         ((uVar3 = (uint)uVar1, (~uVar3 & 0x9fffffff) == 0 &&
          (p->vCis->nSize - p->nRegs <= (int)((uint)(uVar1 >> 0x20) & 0x1fffffff))))) {
        if (pObj < pGVar2 + p->nObjs) {
          Vec_IntPush(vSupp,Entry);
          return;
        }
        break;
      }
      if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                      ,0x1d4,"void Abs_ManSupport1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      Abs_ManSupport1_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff),vSupp);
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar2 = p->pObjs;
    } while (pGVar2 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Abs_ManSupport1_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( pObj->fMark1 || Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Abs_ManSupport1_rec( p, Gia_ObjFanin0(pObj), vSupp );
    Abs_ManSupport1_rec( p, Gia_ObjFanin1(pObj), vSupp );
}